

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O0

Variable __thiscall
LiteScript::_Type_NUMBER::OGreater(_Type_NUMBER *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  Object *pOVar2;
  Type *this_00;
  Type *pTVar3;
  Number *pNVar4;
  Number *pNVar5;
  bool *pbVar6;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar7;
  Variable VVar8;
  undefined1 local_50 [8];
  Variable tmp;
  Variable *obj2_local;
  Variable *obj1_local;
  _Type_NUMBER *this_local;
  Variable *res;
  
  pTVar3 = (Type *)CONCAT71(in_register_00000009,in_CL);
  pOVar2 = Variable::operator->(obj2);
  Memory::Create((Memory *)this,(Type *)pOVar2->memory);
  pOVar2 = Variable::operator->((Variable *)pTVar3);
  this_00 = Object::GetType(pOVar2);
  bVar1 = Type::operator!=(this_00,(Type *)obj1);
  if (bVar1) {
    Variable::Convert((Variable *)local_50,pTVar3);
    pOVar2 = Variable::operator->((Variable *)local_50);
    pTVar3 = Object::GetType(pOVar2);
    bVar1 = Type::operator==(pTVar3,(Type *)obj1);
    if (bVar1) {
      pOVar2 = Variable::operator->(obj2);
      pNVar4 = Object::GetData<LiteScript::Number>(pOVar2);
      pOVar2 = Variable::operator->((Variable *)local_50);
      pNVar5 = Object::GetData<LiteScript::Number>(pOVar2);
      bVar1 = Number::operator>(pNVar4,pNVar5);
      pOVar2 = Variable::operator->((Variable *)this);
      pbVar6 = Object::GetData<bool>(pOVar2);
      *pbVar6 = bVar1;
    }
    Variable::~Variable((Variable *)local_50);
    puVar7 = extraout_RDX;
  }
  else {
    pOVar2 = Variable::operator->(obj2);
    pNVar4 = Object::GetData<LiteScript::Number>(pOVar2);
    pOVar2 = Variable::operator->((Variable *)pTVar3);
    pNVar5 = Object::GetData<LiteScript::Number>(pOVar2);
    bVar1 = Number::operator>(pNVar4,pNVar5);
    pOVar2 = Variable::operator->((Variable *)this);
    pbVar6 = Object::GetData<bool>(pOVar2);
    *pbVar6 = bVar1;
    puVar7 = extraout_RDX_00;
  }
  VVar8.nb_ref = puVar7;
  VVar8.obj = (Object *)this;
  return VVar8;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::OGreater(const LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    Variable res = obj1->memory.Create(Type::BOOLEAN);
    if (obj2->GetType() != *this) {
        Variable tmp = obj2.Convert(*this);
        if (tmp->GetType() == *this)
            res->GetData<bool>() = (obj1->GetData<Number>() > tmp->GetData<Number>());
        return res;
    }
    res->GetData<bool>() = (obj1->GetData<Number>() > obj2->GetData<Number>());
    return res;
}